

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int loop_licm(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  bitmap_t bm;
  VARR_bb_insn_t *varr;
  loop_node_t_conflict loop_00;
  loop_node_t plVar1;
  MIR_insn_t pMVar2;
  long *plVar3;
  void *pvVar4;
  FILE *__s;
  bb_t_conflict pbVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  bb_insn_t_conflict pbVar10;
  bb_insn_t_conflict pbVar11;
  char *pcVar12;
  undefined4 uVar13;
  DLIST_loop_node_t *pDVar14;
  MIR_op_t *pMVar15;
  DLIST_loop_node_t *pDVar16;
  DLIST_bb_insn_t *pDVar17;
  ulong uVar18;
  long *plVar19;
  bb_insn_t pbVar20;
  int op_num;
  bitmap_t local_a8;
  bb_insn_t_conflict local_a0;
  MIR_insn_t local_98;
  bb_insn_t_conflict local_90;
  MIR_context_t local_88;
  MIR_reg_t var;
  int op_num_1;
  insn_var_iterator_t iter;
  MIR_reg_t var_1;
  insn_var_iterator_t local_50;
  
  local_a8 = gen_ctx->temp_bitmap2;
  bm = gen_ctx->temp_bitmap;
  varr = gen_ctx->temp_bb_insns;
  iVar8 = 0;
  bVar6 = false;
  pDVar14 = &loop->children;
  pDVar16 = pDVar14;
  while (loop_00 = pDVar16->head, loop_00 != (loop_node_t_conflict)0x0) {
    if (loop_00->bb == (bb_t)0x0) {
      iVar7 = loop_licm(gen_ctx,loop_00);
      if (iVar7 != 0) {
        iVar8 = 1;
      }
      bVar6 = true;
    }
    pDVar16 = (DLIST_loop_node_t *)&(loop_00->children_link).next;
  }
  if (((!bVar6) && (gen_ctx->curr_cfg->root_loop_node != loop)) &&
     ((loop->u).preheader != (loop_node_t)0x0)) {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"Processing Loop%3lu for loop invariant motion:\n",
              (ulong)loop->index);
    }
    VARR_bb_insn_ttrunc(varr,0);
    bitmap_clear(bm);
    while (plVar1 = pDVar14->head, plVar1 != (loop_node_t)0x0) {
      if (plVar1->bb != (bb_t)0x0) {
        pDVar17 = &plVar1->bb->bb_insns;
        while (pbVar10 = pDVar17->head, pbVar10 != (bb_insn_t_conflict)0x0) {
          iVar7 = loop_invariant_p(gen_ctx,loop,pbVar10,(bitmap_t)0x0);
          if (iVar7 != 0) {
            VARR_bb_insn_tpush(varr,pbVar10);
            bitmap_set_bit_p(bm,(ulong)pbVar10->index);
          }
          pDVar17 = (DLIST_bb_insn_t *)&(pbVar10->bb_insn_link).next;
        }
      }
      pDVar14 = (DLIST_loop_node_t *)&(plVar1->children_link).next;
    }
    for (uVar18 = 0; sVar9 = VARR_bb_insn_tlength(varr), uVar18 < sVar9; uVar18 = uVar18 + 1) {
      pbVar10 = VARR_bb_insn_tget(varr,uVar18);
      pMVar2 = pbVar10->insn;
      iter.nops = (size_t)*(uint *)&pMVar2->field_0x1c;
      iter.op_num = 0;
      iter.op_part_num = 0;
      iter.insn = pMVar2;
      while (iVar7 = output_insn_var_iterator_next(gen_ctx,&iter,&var,&op_num), iVar7 != 0) {
        pMVar15 = pMVar2->ops + op_num;
        while (plVar3 = (long *)pMVar15->data, plVar3 != (long *)0x0) {
          iVar7 = loop_invariant_p(gen_ctx,loop,(bb_insn_t_conflict)*plVar3,bm);
          if ((iVar7 != 0) &&
             (iVar7 = bitmap_set_bit_p(bm,(ulong)*(uint *)(*plVar3 + 0xc)), iVar7 != 0)) {
            VARR_bb_insn_tpush(varr,(bb_insn_t_conflict)*plVar3);
          }
          pMVar15 = (MIR_op_t *)(plVar3 + 4);
        }
      }
    }
    bitmap_clear(local_a8);
    sVar9 = VARR_bb_insn_tlength(varr);
    pbVar10 = (bb_insn_t_conflict)(sVar9 & 0xffffffff);
    while (0 < (int)pbVar10) {
      pbVar10 = (bb_insn_t_conflict)((long)&pbVar10[-1].label_disp + 7);
      pbVar11 = VARR_bb_insn_tget(varr,(size_t)pbVar10);
      pMVar2 = pbVar11->insn;
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("  Considering invariant ",0x18,1,(FILE *)gen_ctx->debug_file);
        print_bb_insn(gen_ctx,pbVar11,0);
      }
      iVar7 = bitmap_bit_p(local_a8,(ulong)pbVar11->index);
      if (iVar7 == 0) {
        local_a0 = pbVar11;
        if (((uint)*(ulong *)&pMVar2->field_0x18 & 0xfffffffe) == 0x2c) {
          if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            fwrite("     -- marked as moved becuase it is costly\n",0x2d,1,
                   (FILE *)gen_ctx->debug_file);
          }
          goto LAB_0013fbb2;
        }
        iter.nops = *(ulong *)&pMVar2->field_0x18 >> 0x20;
        iter.op_num = 0;
        iter.op_part_num = 0;
        uVar13 = 0;
        local_90 = pbVar10;
        iter.insn = pMVar2;
        while( true ) {
          local_98 = (MIR_insn_t)CONCAT44(local_98._4_4_,uVar13);
          iVar7 = input_insn_var_iterator_next(gen_ctx,&iter,&var,&op_num);
          if (iVar7 == 0) break;
          local_88 = (MIR_context_t)CONCAT44(local_88._4_4_,iVar7);
          pvVar4 = pMVar2->ops[op_num].data;
          uVar13 = 1;
          if (((pvVar4 != (void *)0x0) &&
              (iVar7 = bitmap_bit_p(bm,(ulong)*(uint *)(*(long *)((long)pvVar4 + 8) + 0xc)),
              uVar13 = 1, iVar7 != 0)) &&
             (iVar7 = bitmap_bit_p(local_a8,(ulong)*(uint *)(*(long *)((long)pvVar4 + 8) + 0xc)),
             iVar7 == 0)) {
            plVar3 = *(long **)((long)pvVar4 + 8);
            local_50.insn = (MIR_insn_t)*plVar3;
            local_50.nops = (size_t)*(uint *)&(local_50.insn)->field_0x1c;
            local_50.op_num = 0;
            local_50.op_part_num = 0;
            while (iVar7 = output_insn_var_iterator_next(gen_ctx,&local_50,&var_1,&op_num_1),
                  iVar7 != 0) {
              plVar19 = (long *)(*plVar3 + 0x20 + (long)op_num_1 * 0x30);
              while (plVar19 = (long *)*plVar19, plVar19 != (long *)0x0) {
                iVar7 = bitmap_bit_p(bm,(ulong)*(uint *)(*plVar19 + 0xc));
                plVar19 = plVar19 + 4;
                if (iVar7 == 0) {
                  local_98 = (MIR_insn_t)CONCAT44(local_98._4_4_,1);
                  iVar7 = (int)local_88;
                  goto LAB_0013fb5a;
                }
              }
            }
            uVar13 = 1;
          }
        }
LAB_0013fb5a:
        __s = (FILE *)gen_ctx->debug_file;
        if ((__s == (FILE *)0x0) || (gen_ctx->debug_level < 2)) {
LAB_0013fb97:
          pbVar10 = local_90;
          if ((int)local_98 != 0 && iVar7 == 0) {
LAB_0013fbb2:
            mark_as_moved(gen_ctx,local_a0,bm,local_a8);
          }
        }
        else {
          if ((int)local_98 != 0) {
            pcVar12 = "can\'t";
            if (iVar7 == 0) {
              pcVar12 = "can";
            }
            fprintf(__s,"     -- %s be moved because reg presure consideration\n",pcVar12);
            goto LAB_0013fb97;
          }
          fwrite("     -- can\'t be moved because single insn\n",0x2b,1,__s);
          pbVar10 = local_90;
        }
      }
      else if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("     -- already marked as moved\n",0x20,1,(FILE *)gen_ctx->debug_file);
      }
    }
    for (uVar18 = 0; sVar9 = VARR_bb_insn_tlength(varr), uVar18 < sVar9; uVar18 = uVar18 + 1) {
      pbVar10 = VARR_bb_insn_tget(varr,uVar18);
      iVar7 = bitmap_bit_p(local_a8,(ulong)pbVar10->index);
      if (iVar7 != 0) {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)gen_ctx->debug_file,"  Move invariant (target bb%lu) %-5lu",
                  ((loop->u).preheader)->bb->index,(ulong)pbVar10->index);
          print_bb_insn(gen_ctx,pbVar10,0);
        }
        pbVar20 = (loop->entry->bb->bb_insns).head;
        if (pbVar20 == (bb_insn_t)0x0) {
          __assert_fail("before != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14d2,"void licm_move_insn(gen_ctx_t, bb_insn_t, bb_t, bb_insn_t)");
        }
        local_88 = gen_ctx->ctx;
        pMVar2 = pbVar10->insn;
        pbVar5 = ((loop->u).preheader)->bb;
        local_a0 = (bb_insn_t_conflict)&pbVar5->bb_insns;
        local_90 = (pbVar5->bb_insns).tail;
        DLIST_bb_insn_t_remove(&pbVar10->bb->bb_insns,pbVar10);
        pbVar11 = local_90;
        local_98 = pMVar2;
        DLIST_MIR_insn_t_remove(&((gen_ctx->curr_func_item->u).func)->insns,pMVar2);
        if ((pbVar11 == (bb_insn_t_conflict)0x0) || (*(int *)&pbVar11->insn->field_0x18 != 0x76)) {
          DLIST_bb_insn_t_append((DLIST_bb_insn_t *)local_a0,pbVar10);
        }
        else {
          DLIST_bb_insn_t_insert_before((DLIST_bb_insn_t *)local_a0,pbVar11,pbVar10);
          pbVar20 = pbVar11;
        }
        MIR_insert_insn_before(local_88,gen_ctx->curr_func_item,pbVar20->insn,local_98);
        pbVar10->bb = pbVar5;
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

static int loop_licm (gen_ctx_t gen_ctx, loop_node_t loop) {
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  loop_node_t node;
  int subloop_p = FALSE, move_p = FALSE, op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;
  bitmap_t loop_invariant_bb_insn_bitmap = temp_bitmap;
  bitmap_t bb_insns_to_move_bitmap = temp_bitmap2;
  VARR (bb_insn_t) *loop_invariant_bb_insns = temp_bb_insns;

  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      if (loop_licm (gen_ctx, node)) move_p = TRUE; /* process sub-loops first */
    }
  if (subloop_p || curr_cfg->root_loop_node == loop || loop->u.preheader == NULL)
    return move_p; /* e.g. root or unreachable root */
  DEBUG (2, {
    fprintf (debug_file, "Processing Loop%3lu for loop invariant motion:\n",
             (unsigned long) loop->index);
  });
  VARR_TRUNC (bb_insn_t, loop_invariant_bb_insns, 0);
  bitmap_clear (loop_invariant_bb_insn_bitmap);
  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node)) {
    if (node->bb == NULL) continue; /* skip subloops */
    for (bb_insn = DLIST_HEAD (bb_insn_t, node->bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
      if (loop_invariant_p (gen_ctx, loop, bb_insn, NULL)) { /* Push start invariants */
        VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, bb_insn);
        bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index);
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    /* Add insns becoming invariant if we move its inputs: */
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      for (se = insn->ops[op_num].data; se != NULL; se = se->next_use) {
        if (loop_invariant_p (gen_ctx, loop, se->use, loop_invariant_bb_insn_bitmap)
            && bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, se->use->index))
          VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, se->use);
      }
    }
  }
  bitmap_clear (bb_insns_to_move_bitmap);
  for (int i = (int) VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns) - 1; i >= 0; i--) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Considering invariant ");
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    if (bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) {
      DEBUG (2, { fprintf (debug_file, "     -- already marked as moved\n"); });
      continue;
    }
    if (expensive_insn_p (insn)) {
      DEBUG (2, { fprintf (debug_file, "     -- marked as moved becuase it is costly\n"); });
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
      continue;
    }
    int can_be_moved = TRUE, input_var_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      input_var_p = TRUE;
      if ((se = insn->ops[op_num].data) != NULL
          && bitmap_bit_p (loop_invariant_bb_insn_bitmap, se->def->index)
          && !bitmap_bit_p (bb_insns_to_move_bitmap, se->def->index)
          && non_invariant_use_p (gen_ctx, se->def, loop_invariant_bb_insn_bitmap)) {
        can_be_moved = FALSE;
        break;
      }
    }
    DEBUG (2, {
      if (input_var_p)
        fprintf (debug_file, "     -- %s be moved because reg presure consideration\n",
                 can_be_moved ? "can" : "can't");
      else
        fprintf (debug_file, "     -- can't be moved because single insn\n");
    });
    if (can_be_moved && input_var_p)
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    if (!bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) continue;
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Move invariant (target bb%lu) %-5lu",
               (unsigned long) loop->u.preheader->bb->index, (unsigned long) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    licm_move_insn (gen_ctx, bb_insn, loop->u.preheader->bb,
                    DLIST_HEAD (bb_insn_t, loop->entry->bb->bb_insns));
    move_p = TRUE;
  }
  return move_p;
}